

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  int iVar597;
  ulong uVar598;
  ulong uVar599;
  ulong uVar600;
  ulong uVar601;
  ulong uVar602;
  ulong uVar603;
  ulong uVar604;
  ulong uVar605;
  long lVar606;
  ulong uVar607;
  ulong uVar608;
  ulong uVar609;
  ulong uVar610;
  ulong uVar611;
  ulong uVar612;
  ulong uVar613;
  ulong uVar614;
  ulong uVar615;
  ulong uVar616;
  ulong uVar617;
  ulong uVar618;
  ulong uVar619;
  ulong uVar620;
  ulong uVar621;
  ulong uVar622;
  ulong uVar623;
  ulong uVar624;
  ulong uVar625;
  ulong uVar626;
  ulong uVar627;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      uVar612 = (a->z).n[0];
      uVar620 = (a->z).n[1];
      uVar604 = (a->z).n[3];
      uVar607 = uVar612 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar604;
      auVar317._8_8_ = 0;
      auVar317._0_8_ = uVar607;
      uVar605 = (a->z).n[2];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar605;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = uVar620 * 2;
      uVar619 = (a->z).n[4];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar619;
      auVar319._8_8_ = 0;
      auVar319._0_8_ = uVar619;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = SUB168(auVar8 * auVar319,0);
      auVar6 = auVar9 * ZEXT816(0x1000003d10) + auVar7 * auVar318 + auVar6 * auVar317;
      uVar611 = uVar619 * 2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar611;
      auVar320._8_8_ = 0;
      auVar320._0_8_ = uVar612;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar604;
      auVar321._8_8_ = 0;
      auVar321._0_8_ = uVar620 * 2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar605;
      auVar322._8_8_ = 0;
      auVar322._0_8_ = uVar605;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = SUB168(auVar8 * auVar319,8);
      auVar7 = auVar13 * ZEXT816(0x1000003d10000) +
               auVar10 * auVar320 + auVar12 * auVar322 + auVar11 * auVar321 + (auVar6 >> 0x34);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar612;
      auVar323._8_8_ = 0;
      auVar323._0_8_ = uVar612;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar611;
      auVar324._8_8_ = 0;
      auVar324._0_8_ = uVar620;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar604;
      auVar325._8_8_ = 0;
      auVar325._0_8_ = uVar605 * 2;
      auVar8 = auVar16 * auVar325 + auVar15 * auVar324 + (auVar7 >> 0x34);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
      auVar9 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar323;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar620;
      auVar326._8_8_ = 0;
      auVar326._0_8_ = uVar607;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar611;
      auVar327._8_8_ = 0;
      auVar327._0_8_ = uVar605;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar604;
      auVar328._8_8_ = 0;
      auVar328._0_8_ = uVar604;
      auVar8 = auVar20 * auVar328 + auVar19 * auVar327 + (auVar8 >> 0x34);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar10 = auVar21 * ZEXT816(0x1000003d10) + auVar18 * auVar326 + (auVar9 >> 0x34);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar605;
      auVar329._8_8_ = 0;
      auVar329._0_8_ = uVar607;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar620;
      auVar330._8_8_ = 0;
      auVar330._0_8_ = uVar620;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar611;
      auVar331._8_8_ = 0;
      auVar331._0_8_ = uVar604;
      auVar8 = auVar24 * auVar331 + (auVar8 >> 0x34);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = auVar8._0_8_;
      auVar11 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar330 + auVar22 * auVar329 +
                (auVar10 >> 0x34);
      auVar12 = auVar11 >> 0x34;
      auVar574._8_8_ = 0;
      auVar574._0_8_ = auVar12._0_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = auVar8._8_8_;
      auVar573._8_8_ = auVar12._8_8_;
      auVar573._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
      auVar574 = auVar26 * ZEXT816(0x1000003d10000) + auVar573 + auVar574;
      uVar598 = auVar574._0_8_;
      uVar599 = uVar598 & 0xfffffffffffff;
      uVar607 = (b->x).n[0];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar599;
      auVar332._8_8_ = 0;
      auVar332._0_8_ = uVar607;
      uVar600 = auVar11._0_8_ & 0xfffffffffffff;
      uVar611 = (b->x).n[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar600;
      auVar333._8_8_ = 0;
      auVar333._0_8_ = uVar611;
      uVar621 = auVar10._0_8_ & 0xfffffffffffff;
      uVar616 = (b->x).n[2];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar621;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = uVar616;
      uVar625 = auVar9._0_8_ & 0xfffffffffffff;
      uVar617 = (b->x).n[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar625;
      auVar335._8_8_ = 0;
      auVar335._0_8_ = uVar617;
      uVar601 = (auVar574._8_8_ << 0xc | uVar598 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
      uVar598 = (b->x).n[4];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar601;
      auVar336._8_8_ = 0;
      auVar336._0_8_ = uVar598;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = SUB168(auVar31 * auVar336,0);
      auVar6 = auVar32 * ZEXT816(0x1000003d10) +
               auVar27 * auVar332 + auVar28 * auVar333 + auVar30 * auVar335 + auVar29 * auVar334;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar601;
      auVar337._8_8_ = 0;
      auVar337._0_8_ = uVar607;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar599;
      auVar338._8_8_ = 0;
      auVar338._0_8_ = uVar611;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar600;
      auVar339._8_8_ = 0;
      auVar339._0_8_ = uVar616;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar621;
      auVar340._8_8_ = 0;
      auVar340._0_8_ = uVar617;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar625;
      auVar341._8_8_ = 0;
      auVar341._0_8_ = uVar598;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = SUB168(auVar31 * auVar336,8);
      auVar7 = auVar38 * ZEXT816(0x1000003d10000) +
               auVar33 * auVar337 +
               auVar34 * auVar338 + auVar35 * auVar339 + auVar37 * auVar341 + auVar36 * auVar340 +
               (auVar6 >> 0x34);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar625;
      auVar342._8_8_ = 0;
      auVar342._0_8_ = uVar607;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar601;
      auVar343._8_8_ = 0;
      auVar343._0_8_ = uVar611;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar599;
      auVar344._8_8_ = 0;
      auVar344._0_8_ = uVar616;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar600;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = uVar617;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar621;
      auVar346._8_8_ = 0;
      auVar346._0_8_ = uVar598;
      auVar8 = auVar41 * auVar344 + auVar42 * auVar345 + auVar43 * auVar346 + auVar40 * auVar343 +
               (auVar7 >> 0x34);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
      auVar9 = auVar39 * auVar342 + auVar44 * ZEXT816(0x1000003d1);
      uVar602 = auVar9._0_8_;
      uVar624 = auVar9._8_8_;
      auVar562._8_8_ = uVar624 >> 0x34;
      auVar562._0_8_ = uVar624 * 0x1000 | uVar602 >> 0x34;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar621;
      auVar347._8_8_ = 0;
      auVar347._0_8_ = uVar607;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar625;
      auVar348._8_8_ = 0;
      auVar348._0_8_ = uVar611;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar601;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = uVar616;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar599;
      auVar350._8_8_ = 0;
      auVar350._0_8_ = uVar617;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar600;
      auVar351._8_8_ = 0;
      auVar351._0_8_ = uVar598;
      auVar8 = auVar47 * auVar349 + auVar49 * auVar351 + auVar48 * auVar350 + (auVar8 >> 0x34);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar562 = auVar50 * ZEXT816(0x1000003d10) + auVar45 * auVar347 + auVar46 * auVar348 +
                 auVar562;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar600;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = uVar607;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar621;
      auVar353._8_8_ = 0;
      auVar353._0_8_ = uVar611;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar625;
      auVar354._8_8_ = 0;
      auVar354._0_8_ = uVar616;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar601;
      auVar355._8_8_ = 0;
      auVar355._0_8_ = uVar617;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar599;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = uVar598;
      auVar8 = auVar55 * auVar356 + auVar54 * auVar355 + (auVar8 >> 0x34);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = auVar8._0_8_;
      auVar9 = auVar56 * ZEXT816(0x1000003d10) +
               auVar51 * auVar352 + auVar53 * auVar354 + auVar52 * auVar353 + (auVar562 >> 0x34);
      auVar10 = auVar9 >> 0x34;
      auVar576._8_8_ = 0;
      auVar576._0_8_ = auVar10._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auVar8._8_8_;
      auVar575._8_8_ = auVar10._8_8_;
      auVar575._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
      auVar576 = auVar57 * ZEXT816(0x1000003d10000) + auVar575 + auVar576;
      uVar613 = auVar576._0_8_;
      uVar607 = (b->y).n[0];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar599;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = uVar607;
      uVar611 = (b->y).n[1];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar600;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = uVar611;
      uVar616 = (b->y).n[2];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar621;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = uVar616;
      uVar617 = (b->y).n[3];
      uVar598 = (b->y).n[4];
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar625;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = uVar617;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar601;
      auVar361._8_8_ = 0;
      auVar361._0_8_ = uVar598;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = SUB168(auVar62 * auVar361,0);
      auVar6 = auVar63 * ZEXT816(0x1000003d10) +
               auVar58 * auVar357 + auVar59 * auVar358 + auVar61 * auVar360 + auVar60 * auVar359;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar601;
      auVar362._8_8_ = 0;
      auVar362._0_8_ = uVar607;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar599;
      auVar363._8_8_ = 0;
      auVar363._0_8_ = uVar611;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar600;
      auVar364._8_8_ = 0;
      auVar364._0_8_ = uVar616;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar621;
      auVar365._8_8_ = 0;
      auVar365._0_8_ = uVar617;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar625;
      auVar366._8_8_ = 0;
      auVar366._0_8_ = uVar598;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = SUB168(auVar62 * auVar361,8);
      auVar8 = auVar69 * ZEXT816(0x1000003d10000) +
               auVar64 * auVar362 +
               auVar65 * auVar363 + auVar68 * auVar366 + auVar67 * auVar365 + auVar66 * auVar364 +
               (auVar6 >> 0x34);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar625;
      auVar367._8_8_ = 0;
      auVar367._0_8_ = uVar607;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar601;
      auVar368._8_8_ = 0;
      auVar368._0_8_ = uVar611;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar599;
      auVar369._8_8_ = 0;
      auVar369._0_8_ = uVar616;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar600;
      auVar370._8_8_ = 0;
      auVar370._0_8_ = uVar617;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar621;
      auVar371._8_8_ = 0;
      auVar371._0_8_ = uVar598;
      auVar10 = (auVar8 >> 0x34) +
                auVar71 * auVar368 + auVar72 * auVar369 + auVar74 * auVar371 + auVar73 * auVar370;
      uVar624 = auVar10._0_8_;
      uVar615 = auVar10._8_8_;
      auVar563._8_8_ = uVar615 >> 0x34;
      auVar563._0_8_ = uVar615 * 0x1000 | uVar624 >> 0x34;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar624 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar8._6_2_ & 0xf);
      auVar10 = auVar70 * auVar367 + auVar75 * ZEXT816(0x1000003d1);
      uVar624 = auVar10._0_8_;
      uVar615 = auVar10._8_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar621;
      auVar372._8_8_ = 0;
      auVar372._0_8_ = uVar607;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar625;
      auVar373._8_8_ = 0;
      auVar373._0_8_ = uVar611;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar601;
      auVar374._8_8_ = 0;
      auVar374._0_8_ = uVar616;
      auVar577._8_8_ = uVar615 >> 0x34;
      auVar577._0_8_ = uVar615 * 0x1000 | uVar624 >> 0x34;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar599;
      auVar375._8_8_ = 0;
      auVar375._0_8_ = uVar617;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar600;
      auVar376._8_8_ = 0;
      auVar376._0_8_ = uVar598;
      auVar563 = auVar78 * auVar374 + auVar79 * auVar375 + auVar80 * auVar376 + auVar563;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = auVar563._0_8_ & 0xfffffffffffff;
      auVar577 = auVar81 * ZEXT816(0x1000003d10) + auVar76 * auVar372 + auVar77 * auVar373 +
                 auVar577;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar600;
      auVar377._8_8_ = 0;
      auVar377._0_8_ = uVar607;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar621;
      auVar378._8_8_ = 0;
      auVar378._0_8_ = uVar611;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar625;
      auVar379._8_8_ = 0;
      auVar379._0_8_ = uVar616;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar601;
      auVar380._8_8_ = 0;
      auVar380._0_8_ = uVar617;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar599;
      auVar381._8_8_ = 0;
      auVar381._0_8_ = uVar598;
      auVar10 = auVar86 * auVar381 + auVar85 * auVar380 + (auVar563 >> 0x34);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = auVar10._0_8_;
      auVar11 = auVar87 * ZEXT816(0x1000003d10) +
                auVar82 * auVar377 + auVar84 * auVar379 + auVar83 * auVar378 + (auVar577 >> 0x34);
      auVar12 = auVar11 >> 0x34;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = auVar12._0_8_;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = auVar10._8_8_;
      auVar578._8_8_ = auVar12._8_8_;
      auVar578._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
      auVar579 = auVar88 * ZEXT816(0x1000003d10000) + auVar578 + auVar579;
      uVar611 = auVar579._0_8_;
      uVar624 = uVar624 & 0xfffffffffffff;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar624;
      auVar382._8_8_ = 0;
      auVar382._0_8_ = uVar604;
      uVar617 = (auVar579._8_8_ << 0xc | uVar611 >> 0x34) + (auVar8._0_8_ & 0xffffffffffff);
      uVar616 = auVar577._0_8_ & 0xfffffffffffff;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar616;
      auVar383._8_8_ = 0;
      auVar383._0_8_ = uVar605;
      uVar607 = auVar11._0_8_ & 0xfffffffffffff;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar607;
      auVar384._8_8_ = 0;
      auVar384._0_8_ = uVar620;
      uVar611 = uVar611 & 0xfffffffffffff;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar611;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = uVar612;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar617;
      auVar386._8_8_ = 0;
      auVar386._0_8_ = uVar619;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = SUB168(auVar93 * auVar386,0);
      auVar11 = auVar90 * auVar383 + auVar89 * auVar382 + auVar91 * auVar384 + auVar92 * auVar385 +
                auVar94 * ZEXT816(0x1000003d10);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar624;
      auVar387._8_8_ = 0;
      auVar387._0_8_ = uVar619;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar616;
      auVar388._8_8_ = 0;
      auVar388._0_8_ = uVar604;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar607;
      auVar389._8_8_ = 0;
      auVar389._0_8_ = uVar605;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar611;
      auVar390._8_8_ = 0;
      auVar390._0_8_ = uVar620;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar617;
      auVar391._8_8_ = 0;
      auVar391._0_8_ = uVar612;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = SUB168(auVar93 * auVar386,8);
      auVar6 = auVar100 * ZEXT816(0x1000003d10000) +
               auVar97 * auVar389 + auVar95 * auVar387 + auVar96 * auVar388 + auVar98 * auVar390 +
               auVar99 * auVar391 + (auVar11 >> 0x34);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar624;
      auVar392._8_8_ = 0;
      auVar392._0_8_ = uVar612;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar616;
      auVar393._8_8_ = 0;
      auVar393._0_8_ = uVar619;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar607;
      auVar394._8_8_ = 0;
      auVar394._0_8_ = uVar604;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar611;
      auVar395._8_8_ = 0;
      auVar395._0_8_ = uVar605;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar617;
      auVar396._8_8_ = 0;
      auVar396._0_8_ = uVar620;
      auVar8 = auVar105 * auVar396 + auVar104 * auVar395 + auVar103 * auVar394 + auVar102 * auVar393
               + (auVar6 >> 0x34);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
      auVar10 = auVar101 * auVar392 + auVar106 * ZEXT816(0x1000003d1);
      uVar599 = auVar10._0_8_;
      uVar598 = auVar10._8_8_;
      auVar564._8_8_ = uVar598 >> 0x34;
      auVar564._0_8_ = uVar598 * 0x1000 | uVar599 >> 0x34;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar624;
      auVar397._8_8_ = 0;
      auVar397._0_8_ = uVar620;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar616;
      auVar398._8_8_ = 0;
      auVar398._0_8_ = uVar612;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar607;
      auVar399._8_8_ = 0;
      auVar399._0_8_ = uVar619;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar611;
      auVar400._8_8_ = 0;
      auVar400._0_8_ = uVar604;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar617;
      auVar401._8_8_ = 0;
      auVar401._0_8_ = uVar605;
      auVar8 = auVar111 * auVar401 + auVar110 * auVar400 + auVar109 * auVar399 + (auVar8 >> 0x34);
      auVar112._8_8_ = 0;
      auVar112._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar564 = auVar112 * ZEXT816(0x1000003d10) + auVar107 * auVar397 + auVar108 * auVar398 +
                 auVar564;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar624;
      auVar402._8_8_ = 0;
      auVar402._0_8_ = uVar605;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar616;
      auVar403._8_8_ = 0;
      auVar403._0_8_ = uVar620;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar607;
      auVar404._8_8_ = 0;
      auVar404._0_8_ = uVar612;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = uVar611;
      auVar405._8_8_ = 0;
      auVar405._0_8_ = uVar619;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar617;
      auVar406._8_8_ = 0;
      auVar406._0_8_ = uVar604;
      auVar8 = auVar116 * auVar405 + auVar117 * auVar406 + (auVar8 >> 0x34);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = auVar8._0_8_;
      auVar10 = auVar118 * ZEXT816(0x1000003d10) +
                auVar115 * auVar404 + auVar113 * auVar402 + auVar114 * auVar403 + (auVar564 >> 0x34)
      ;
      auVar12 = auVar10 >> 0x34;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = auVar12._0_8_;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = auVar8._8_8_;
      auVar580._8_8_ = auVar12._8_8_;
      auVar580._0_8_ = auVar11._0_8_ & 0xfffffffffffff;
      auVar581 = auVar119 * ZEXT816(0x1000003d10000) + auVar580 + auVar581;
      uVar601 = auVar581._0_8_;
      uVar612 = (a->x).n[0];
      uVar621 = ((uVar602 & 0xfffffffffffff) - uVar612) + 0x9ffff5ffffd9d6;
      uVar620 = (a->x).n[1];
      uVar602 = ((auVar562._0_8_ & 0xfffffffffffff) - uVar620) + 0x9ffffffffffff6;
      uVar604 = (a->x).n[2];
      uVar615 = ((auVar9._0_8_ & 0xfffffffffffff) - uVar604) + 0x9ffffffffffff6;
      uVar605 = (a->x).n[3];
      uVar624 = ((uVar613 & 0xfffffffffffff) - uVar605) + 0x9ffffffffffff6;
      uVar619 = (a->x).n[4];
      uVar600 = ((auVar7._0_8_ & 0xffffffffffff) - uVar619) + 0x9fffffffffff6 +
                (auVar576._8_8_ << 0xc | uVar613 >> 0x34);
      uVar607 = (a->y).n[0];
      uVar611 = (a->y).n[1];
      uVar616 = (a->y).n[2];
      uVar617 = (a->y).n[3];
      uVar598 = (a->y).n[4];
      uVar625 = (uVar607 - (uVar599 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
      uVar613 = (uVar611 - (auVar564._0_8_ & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar599 = (uVar616 - (auVar10._0_8_ & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar626 = (uVar617 - (uVar601 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar601 = (uVar598 -
                ((auVar581._8_8_ << 0xc | uVar601 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff))) +
                0x3fffffffffffc;
      local_80.n[0] = uVar625;
      local_80.n[1] = uVar613;
      local_80.n[2] = uVar599;
      local_80.n[3] = uVar626;
      local_80.n[4] = uVar601;
      local_58.n[0] = uVar621;
      local_58.n[1] = uVar602;
      local_58.n[2] = uVar615;
      local_58.n[3] = uVar624;
      local_58.n[4] = uVar600;
      iVar597 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
      if (iVar597 == 0) {
        r->infinity = 0;
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_58.n[4];
          rzr->n[2] = local_58.n[2];
          rzr->n[3] = local_58.n[3];
          rzr->n[0] = local_58.n[0];
          rzr->n[1] = local_58.n[1];
        }
        uVar627 = (a->z).n[0];
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar627;
        auVar407._8_8_ = 0;
        auVar407._0_8_ = uVar624;
        uVar608 = (a->z).n[1];
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar608;
        auVar408._8_8_ = 0;
        auVar408._0_8_ = uVar615;
        uVar609 = (a->z).n[2];
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar609;
        auVar409._8_8_ = 0;
        auVar409._0_8_ = uVar602;
        uVar618 = (a->z).n[3];
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar618;
        auVar410._8_8_ = 0;
        auVar410._0_8_ = uVar621;
        uVar610 = (a->z).n[4];
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar610;
        auVar411._8_8_ = 0;
        auVar411._0_8_ = uVar600;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = SUB168(auVar124 * auVar411,0);
        auVar9 = auVar121 * auVar408 + auVar120 * auVar407 + auVar122 * auVar409 +
                 auVar123 * auVar410 + auVar125 * ZEXT816(0x1000003d10);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar627;
        auVar412._8_8_ = 0;
        auVar412._0_8_ = uVar600;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar608;
        auVar413._8_8_ = 0;
        auVar413._0_8_ = uVar624;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = uVar609;
        auVar414._8_8_ = 0;
        auVar414._0_8_ = uVar615;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = uVar618;
        auVar415._8_8_ = 0;
        auVar415._0_8_ = uVar602;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar610;
        auVar416._8_8_ = 0;
        auVar416._0_8_ = uVar621;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = SUB168(auVar124 * auVar411,8);
        auVar6 = auVar131 * ZEXT816(0x1000003d10000) +
                 auVar130 * auVar416 +
                 auVar129 * auVar415 +
                 auVar128 * auVar414 + auVar126 * auVar412 + auVar127 * auVar413 + (auVar9 >> 0x34);
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar627;
        auVar417._8_8_ = 0;
        auVar417._0_8_ = uVar621;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = uVar608;
        auVar418._8_8_ = 0;
        auVar418._0_8_ = uVar600;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = uVar609;
        auVar419._8_8_ = 0;
        auVar419._0_8_ = uVar624;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = uVar618;
        auVar420._8_8_ = 0;
        auVar420._0_8_ = uVar615;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = uVar610;
        auVar421._8_8_ = 0;
        auVar421._0_8_ = uVar602;
        auVar7 = auVar136 * auVar421 +
                 auVar135 * auVar420 + auVar134 * auVar419 + auVar133 * auVar418 + (auVar6 >> 0x34);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
        auVar8 = auVar132 * auVar417 + auVar137 * ZEXT816(0x1000003d1);
        uVar603 = auVar8._0_8_;
        uVar622 = auVar8._8_8_;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = uVar627;
        auVar422._8_8_ = 0;
        auVar422._0_8_ = uVar602;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar608;
        auVar423._8_8_ = 0;
        auVar423._0_8_ = uVar621;
        auVar565._8_8_ = uVar622 >> 0x34;
        auVar565._0_8_ = uVar622 * 0x1000 | uVar603 >> 0x34;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = uVar609;
        auVar424._8_8_ = 0;
        auVar424._0_8_ = uVar600;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = uVar618;
        auVar425._8_8_ = 0;
        auVar425._0_8_ = uVar624;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar610;
        auVar426._8_8_ = 0;
        auVar426._0_8_ = uVar615;
        auVar7 = auVar142 * auVar426 + auVar141 * auVar425 + auVar140 * auVar424 + (auVar7 >> 0x34);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
        auVar565 = auVar143 * ZEXT816(0x1000003d10) + auVar138 * auVar422 + auVar139 * auVar423 +
                   auVar565;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = uVar627;
        auVar427._8_8_ = 0;
        auVar427._0_8_ = uVar615;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = uVar608;
        auVar428._8_8_ = 0;
        auVar428._0_8_ = uVar602;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar609;
        auVar429._8_8_ = 0;
        auVar429._0_8_ = uVar621;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = uVar618;
        auVar430._8_8_ = 0;
        auVar430._0_8_ = uVar600;
        auVar148._8_8_ = 0;
        auVar148._0_8_ = uVar610;
        auVar431._8_8_ = 0;
        auVar431._0_8_ = uVar624;
        auVar7 = auVar148 * auVar431 + auVar147 * auVar430 + (auVar7 >> 0x34);
        auVar149._8_8_ = 0;
        auVar149._0_8_ = auVar7._0_8_;
        auVar8 = auVar149 * ZEXT816(0x1000003d10) +
                 auVar146 * auVar429 + auVar144 * auVar427 + auVar145 * auVar428 +
                 (auVar565 >> 0x34);
        auVar10 = auVar8 >> 0x34;
        auVar583._8_8_ = 0;
        auVar583._0_8_ = auVar10._0_8_;
        auVar150._8_8_ = 0;
        auVar150._0_8_ = auVar7._8_8_;
        auVar582._8_8_ = auVar10._8_8_;
        auVar582._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
        auVar583 = auVar150 * ZEXT816(0x1000003d10000) + auVar582 + auVar583;
        uVar614 = auVar583._0_8_;
        uVar627 = uVar621 * 2;
        auVar151._8_8_ = 0;
        auVar151._0_8_ = uVar624;
        auVar432._8_8_ = 0;
        auVar432._0_8_ = uVar627;
        auVar152._8_8_ = 0;
        auVar152._0_8_ = uVar615;
        auVar433._8_8_ = 0;
        auVar433._0_8_ = uVar602 * 2;
        auVar153._8_8_ = 0;
        auVar153._0_8_ = uVar600;
        auVar434._8_8_ = 0;
        auVar434._0_8_ = uVar600;
        auVar154._8_8_ = 0;
        auVar154._0_8_ = SUB168(auVar153 * auVar434,0);
        auVar10 = auVar152 * auVar433 + auVar151 * auVar432 + auVar154 * ZEXT816(0x1000003d10);
        uVar608 = uVar600 * 2;
        auVar155._8_8_ = 0;
        auVar155._0_8_ = uVar608;
        auVar435._8_8_ = 0;
        auVar435._0_8_ = uVar621;
        auVar156._8_8_ = 0;
        auVar156._0_8_ = uVar624;
        auVar436._8_8_ = 0;
        auVar436._0_8_ = uVar602 * 2;
        auVar157._8_8_ = 0;
        auVar157._0_8_ = uVar615;
        auVar437._8_8_ = 0;
        auVar437._0_8_ = uVar615;
        auVar158._8_8_ = 0;
        auVar158._0_8_ = SUB168(auVar153 * auVar434,8);
        auVar7 = auVar158 * ZEXT816(0x1000003d10000) +
                 auVar155 * auVar435 + auVar157 * auVar437 + auVar156 * auVar436 + (auVar10 >> 0x34)
        ;
        auVar159._8_8_ = 0;
        auVar159._0_8_ = uVar621;
        auVar438._8_8_ = 0;
        auVar438._0_8_ = uVar621;
        auVar160._8_8_ = 0;
        auVar160._0_8_ = uVar608;
        auVar439._8_8_ = 0;
        auVar439._0_8_ = uVar602;
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uVar624;
        auVar440._8_8_ = 0;
        auVar440._0_8_ = uVar615 * 2;
        auVar9 = auVar161 * auVar440 + auVar160 * auVar439 + (auVar7 >> 0x34);
        auVar162._8_8_ = 0;
        auVar162._0_8_ = (auVar9._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
        auVar11 = auVar162 * ZEXT816(0x1000003d1) + auVar159 * auVar438;
        auVar163._8_8_ = 0;
        auVar163._0_8_ = uVar602;
        auVar441._8_8_ = 0;
        auVar441._0_8_ = uVar627;
        auVar164._8_8_ = 0;
        auVar164._0_8_ = uVar608;
        auVar442._8_8_ = 0;
        auVar442._0_8_ = uVar615;
        auVar165._8_8_ = 0;
        auVar165._0_8_ = uVar624;
        auVar443._8_8_ = 0;
        auVar443._0_8_ = uVar624;
        auVar9 = auVar165 * auVar443 + auVar164 * auVar442 + (auVar9 >> 0x34);
        auVar166._8_8_ = 0;
        auVar166._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
        auVar12 = (auVar11 >> 0x34) + auVar166 * ZEXT816(0x1000003d10) + auVar163 * auVar441;
        uVar618 = auVar12._0_8_;
        uVar609 = auVar12._8_8_;
        auVar566._8_8_ = uVar609 >> 0x34;
        auVar566._0_8_ = uVar609 * 0x1000 | uVar618 >> 0x34;
        auVar167._8_8_ = 0;
        auVar167._0_8_ = uVar615;
        auVar444._8_8_ = 0;
        auVar444._0_8_ = uVar627;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = uVar602;
        auVar445._8_8_ = 0;
        auVar445._0_8_ = uVar602;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = uVar608;
        auVar446._8_8_ = 0;
        auVar446._0_8_ = uVar624;
        auVar9 = auVar169 * auVar446 + (auVar9 >> 0x34);
        auVar170._8_8_ = 0;
        auVar170._0_8_ = auVar9._0_8_;
        auVar566 = auVar170 * ZEXT816(0x1000003d10) + auVar168 * auVar445 + auVar167 * auVar444 +
                   auVar566;
        auVar12 = auVar566 >> 0x34;
        auVar585._8_8_ = 0;
        auVar585._0_8_ = auVar12._0_8_;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = auVar9._8_8_;
        auVar584._8_8_ = auVar12._8_8_;
        auVar584._0_8_ = auVar10._0_8_ & 0xffffffffffffe;
        auVar585 = auVar171 * ZEXT816(0x1000003d10000) + auVar584 + auVar585;
        uVar627 = auVar585._0_8_;
        uVar608 = 0x3ffffbfffff0bc - (auVar11._0_8_ & 0xfffffffffffff);
        uVar609 = 0x3ffffffffffffc - (uVar618 & 0xfffffffffffff);
        uVar622 = 0x3ffffffffffffc - (auVar566._0_8_ & 0xfffffffffffff);
        uVar623 = 0x3ffffffffffffc - (uVar627 & 0xfffffffffffff);
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uVar608;
        auVar447._8_8_ = 0;
        auVar447._0_8_ = uVar624;
        uVar618 = 0x3fffffffffffc -
                  ((auVar585._8_8_ << 0xc | uVar627 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff));
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar609;
        auVar448._8_8_ = 0;
        auVar448._0_8_ = uVar615;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = uVar622;
        auVar449._8_8_ = 0;
        auVar449._0_8_ = uVar602;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = uVar623;
        auVar450._8_8_ = 0;
        auVar450._0_8_ = uVar621;
        auVar176._8_8_ = 0;
        auVar176._0_8_ = uVar618;
        auVar451._8_8_ = 0;
        auVar451._0_8_ = uVar600;
        auVar177._8_8_ = 0;
        auVar177._0_8_ = SUB168(auVar176 * auVar451,0);
        auVar7 = auVar177 * ZEXT816(0x1000003d10) +
                 auVar173 * auVar448 + auVar172 * auVar447 + auVar174 * auVar449 +
                 auVar175 * auVar450;
        auVar178._8_8_ = 0;
        auVar178._0_8_ = uVar608;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = uVar600;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = uVar609;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = uVar624;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = uVar622;
        auVar454._8_8_ = 0;
        auVar454._0_8_ = uVar615;
        auVar181._8_8_ = 0;
        auVar181._0_8_ = uVar623;
        auVar455._8_8_ = 0;
        auVar455._0_8_ = uVar602;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = uVar618;
        auVar456._8_8_ = 0;
        auVar456._0_8_ = uVar621;
        auVar183._8_8_ = 0;
        auVar183._0_8_ = SUB168(auVar176 * auVar451,8);
        auVar11 = auVar183 * ZEXT816(0x1000003d10000) +
                  auVar182 * auVar456 +
                  auVar181 * auVar455 +
                  auVar180 * auVar454 + auVar179 * auVar453 + auVar178 * auVar452 + (auVar7 >> 0x34)
        ;
        auVar184._8_8_ = 0;
        auVar184._0_8_ = uVar608;
        auVar457._8_8_ = 0;
        auVar457._0_8_ = uVar621;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = uVar609;
        auVar458._8_8_ = 0;
        auVar458._0_8_ = uVar600;
        auVar186._8_8_ = 0;
        auVar186._0_8_ = uVar622;
        auVar459._8_8_ = 0;
        auVar459._0_8_ = uVar624;
        auVar187._8_8_ = 0;
        auVar187._0_8_ = uVar623;
        auVar460._8_8_ = 0;
        auVar460._0_8_ = uVar615;
        auVar188._8_8_ = 0;
        auVar188._0_8_ = uVar618;
        auVar461._8_8_ = 0;
        auVar461._0_8_ = uVar602;
        auVar9 = auVar188 * auVar461 +
                 auVar187 * auVar460 + auVar186 * auVar459 + auVar185 * auVar458 + (auVar11 >> 0x34)
        ;
        auVar189._8_8_ = 0;
        auVar189._0_8_ = (auVar9._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar11._6_2_ & 0xf);
        auVar10 = auVar184 * auVar457 + auVar189 * ZEXT816(0x1000003d1);
        uVar627 = auVar10._0_8_;
        uVar610 = auVar10._8_8_;
        auVar567._8_8_ = uVar610 >> 0x34;
        auVar567._0_8_ = uVar610 * 0x1000 | uVar627 >> 0x34;
        auVar190._8_8_ = 0;
        auVar190._0_8_ = uVar608;
        auVar462._8_8_ = 0;
        auVar462._0_8_ = uVar602;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = uVar609;
        auVar463._8_8_ = 0;
        auVar463._0_8_ = uVar621;
        uVar627 = uVar627 & 0xfffffffffffff;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = uVar622;
        auVar464._8_8_ = 0;
        auVar464._0_8_ = uVar600;
        auVar193._8_8_ = 0;
        auVar193._0_8_ = uVar623;
        auVar465._8_8_ = 0;
        auVar465._0_8_ = uVar624;
        auVar194._8_8_ = 0;
        auVar194._0_8_ = uVar618;
        auVar466._8_8_ = 0;
        auVar466._0_8_ = uVar615;
        auVar9 = auVar194 * auVar466 + auVar193 * auVar465 + auVar192 * auVar464 + (auVar9 >> 0x34);
        auVar195._8_8_ = 0;
        auVar195._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
        auVar567 = auVar195 * ZEXT816(0x1000003d10) + auVar191 * auVar463 + auVar190 * auVar462 +
                   auVar567;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = uVar608;
        auVar467._8_8_ = 0;
        auVar467._0_8_ = uVar615;
        auVar197._8_8_ = 0;
        auVar197._0_8_ = uVar609;
        auVar468._8_8_ = 0;
        auVar468._0_8_ = uVar602;
        auVar198._8_8_ = 0;
        auVar198._0_8_ = uVar622;
        auVar469._8_8_ = 0;
        auVar469._0_8_ = uVar621;
        uVar615 = auVar567._0_8_ & 0xfffffffffffff;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = uVar623;
        auVar470._8_8_ = 0;
        auVar470._0_8_ = uVar600;
        auVar200._8_8_ = 0;
        auVar200._0_8_ = uVar618;
        auVar471._8_8_ = 0;
        auVar471._0_8_ = uVar624;
        auVar9 = auVar200 * auVar471 + auVar199 * auVar470 + (auVar9 >> 0x34);
        auVar201._8_8_ = 0;
        auVar201._0_8_ = auVar9._0_8_;
        auVar10 = auVar201 * ZEXT816(0x1000003d10) +
                  auVar198 * auVar469 + auVar197 * auVar468 + auVar196 * auVar467 +
                  (auVar567 >> 0x34);
        auVar12 = auVar10 >> 0x34;
        auVar587._8_8_ = 0;
        auVar587._0_8_ = auVar12._0_8_;
        uVar600 = auVar10._0_8_ & 0xfffffffffffff;
        auVar202._8_8_ = 0;
        auVar202._0_8_ = auVar9._8_8_;
        auVar586._8_8_ = auVar12._8_8_;
        auVar586._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
        auVar587 = auVar202 * ZEXT816(0x1000003d10000) + auVar586 + auVar587;
        uVar602 = auVar587._0_8_;
        auVar203._8_8_ = 0;
        auVar203._0_8_ = uVar623;
        auVar472._8_8_ = 0;
        auVar472._0_8_ = uVar612;
        auVar204._8_8_ = 0;
        auVar204._0_8_ = uVar622;
        auVar473._8_8_ = 0;
        auVar473._0_8_ = uVar620;
        auVar205._8_8_ = 0;
        auVar205._0_8_ = uVar609;
        auVar474._8_8_ = 0;
        auVar474._0_8_ = uVar604;
        uVar621 = (auVar587._8_8_ << 0xc | uVar602 >> 0x34) + (auVar11._0_8_ & 0xffffffffffff);
        auVar206._8_8_ = 0;
        auVar206._0_8_ = uVar608;
        auVar475._8_8_ = 0;
        auVar475._0_8_ = uVar605;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = uVar618;
        auVar476._8_8_ = 0;
        auVar476._0_8_ = uVar619;
        auVar208._8_8_ = 0;
        auVar208._0_8_ = SUB168(auVar207 * auVar476,0);
        uVar602 = uVar602 & 0xfffffffffffff;
        auVar7 = auVar208 * ZEXT816(0x1000003d10) +
                 auVar204 * auVar473 + auVar206 * auVar475 + auVar205 * auVar474 +
                 auVar203 * auVar472;
        auVar209._8_8_ = 0;
        auVar209._0_8_ = uVar618;
        auVar477._8_8_ = 0;
        auVar477._0_8_ = uVar612;
        auVar210._8_8_ = 0;
        auVar210._0_8_ = uVar623;
        auVar478._8_8_ = 0;
        auVar478._0_8_ = uVar620;
        auVar211._8_8_ = 0;
        auVar211._0_8_ = uVar622;
        auVar479._8_8_ = 0;
        auVar479._0_8_ = uVar604;
        auVar212._8_8_ = 0;
        auVar212._0_8_ = uVar609;
        auVar480._8_8_ = 0;
        auVar480._0_8_ = uVar605;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = uVar608;
        auVar481._8_8_ = 0;
        auVar481._0_8_ = uVar619;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = SUB168(auVar207 * auVar476,8);
        auVar9 = auVar214 * ZEXT816(0x1000003d10000) +
                 auVar210 * auVar478 +
                 auVar211 * auVar479 + auVar213 * auVar481 + auVar212 * auVar480 +
                 auVar209 * auVar477 + (auVar7 >> 0x34);
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar608;
        auVar482._8_8_ = 0;
        auVar482._0_8_ = uVar612;
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar618;
        auVar483._8_8_ = 0;
        auVar483._0_8_ = uVar620;
        auVar217._8_8_ = 0;
        auVar217._0_8_ = uVar623;
        auVar484._8_8_ = 0;
        auVar484._0_8_ = uVar604;
        auVar218._8_8_ = 0;
        auVar218._0_8_ = uVar622;
        auVar485._8_8_ = 0;
        auVar485._0_8_ = uVar605;
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar609;
        auVar486._8_8_ = 0;
        auVar486._0_8_ = uVar619;
        auVar10 = (auVar9 >> 0x34) +
                  auVar216 * auVar483 +
                  auVar219 * auVar486 + auVar218 * auVar485 + auVar217 * auVar484;
        uVar624 = auVar10._0_8_;
        uVar610 = auVar10._8_8_;
        auVar588._8_8_ = uVar610 >> 0x34;
        auVar588._0_8_ = uVar610 * 0x1000 | uVar624 >> 0x34;
        auVar220._8_8_ = 0;
        auVar220._0_8_ = uVar624 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar9._6_2_ & 0xf);
        auVar10 = auVar215 * auVar482 + auVar220 * ZEXT816(0x1000003d1);
        uVar624 = auVar10._0_8_;
        uVar610 = auVar10._8_8_;
        auVar568._8_8_ = uVar610 >> 0x34;
        auVar568._0_8_ = uVar610 * 0x1000 | uVar624 >> 0x34;
        auVar221._8_8_ = 0;
        auVar221._0_8_ = uVar609;
        auVar487._8_8_ = 0;
        auVar487._0_8_ = uVar612;
        auVar222._8_8_ = 0;
        auVar222._0_8_ = uVar608;
        auVar488._8_8_ = 0;
        auVar488._0_8_ = uVar620;
        auVar223._8_8_ = 0;
        auVar223._0_8_ = uVar618;
        auVar489._8_8_ = 0;
        auVar489._0_8_ = uVar604;
        uVar624 = uVar624 & 0xfffffffffffff;
        auVar224._8_8_ = 0;
        auVar224._0_8_ = uVar623;
        auVar490._8_8_ = 0;
        auVar490._0_8_ = uVar605;
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar622;
        auVar491._8_8_ = 0;
        auVar491._0_8_ = uVar619;
        auVar588 = auVar223 * auVar489 + auVar225 * auVar491 + auVar224 * auVar490 + auVar588;
        auVar226._8_8_ = 0;
        auVar226._0_8_ = auVar588._0_8_ & 0xfffffffffffff;
        auVar568 = auVar226 * ZEXT816(0x1000003d10) + auVar221 * auVar487 + auVar222 * auVar488 +
                   auVar568;
        auVar227._8_8_ = 0;
        auVar227._0_8_ = uVar622;
        auVar492._8_8_ = 0;
        auVar492._0_8_ = uVar612;
        auVar228._8_8_ = 0;
        auVar228._0_8_ = uVar609;
        auVar493._8_8_ = 0;
        auVar493._0_8_ = uVar620;
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar608;
        auVar494._8_8_ = 0;
        auVar494._0_8_ = uVar604;
        uVar608 = auVar568._0_8_ & 0xfffffffffffff;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = uVar618;
        auVar495._8_8_ = 0;
        auVar495._0_8_ = uVar605;
        auVar231._8_8_ = 0;
        auVar231._0_8_ = uVar623;
        auVar496._8_8_ = 0;
        auVar496._0_8_ = uVar619;
        auVar10 = auVar231 * auVar496 + auVar230 * auVar495 + (auVar588 >> 0x34);
        auVar232._8_8_ = 0;
        auVar232._0_8_ = auVar10._0_8_;
        auVar11 = auVar232 * ZEXT816(0x1000003d10) +
                  auVar227 * auVar492 + auVar229 * auVar494 + auVar228 * auVar493 +
                  (auVar568 >> 0x34);
        auVar12 = auVar11 >> 0x34;
        auVar590._8_8_ = 0;
        auVar590._0_8_ = auVar12._0_8_;
        uVar604 = auVar11._0_8_ & 0xfffffffffffff;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = auVar10._8_8_;
        auVar589._8_8_ = auVar12._8_8_;
        auVar589._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
        auVar590 = auVar233 * ZEXT816(0x1000003d10000) + auVar589 + auVar590;
        uVar605 = auVar590._0_8_;
        lVar606 = (auVar590._8_8_ << 0xc | uVar605 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
        uVar605 = uVar605 & 0xfffffffffffff;
        uVar612 = uVar625 * 2;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = uVar626;
        auVar497._8_8_ = 0;
        auVar497._0_8_ = uVar612;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = uVar599;
        auVar498._8_8_ = 0;
        auVar498._0_8_ = uVar613 * 2;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar601;
        auVar499._8_8_ = 0;
        auVar499._0_8_ = uVar601;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = SUB168(auVar236 * auVar499,0);
        auVar10 = auVar235 * auVar498 + auVar234 * auVar497 + auVar237 * ZEXT816(0x1000003d10);
        uVar620 = uVar601 * 2;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = uVar620;
        auVar500._8_8_ = 0;
        auVar500._0_8_ = uVar625;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = uVar626;
        auVar501._8_8_ = 0;
        auVar501._0_8_ = uVar613 * 2;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = uVar599;
        auVar502._8_8_ = 0;
        auVar502._0_8_ = uVar599;
        auVar241._8_8_ = 0;
        auVar241._0_8_ = SUB168(auVar236 * auVar499,8);
        auVar7 = auVar241 * ZEXT816(0x1000003d10000) +
                 auVar238 * auVar500 + auVar240 * auVar502 + auVar239 * auVar501 + (auVar10 >> 0x34)
        ;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = uVar625;
        auVar503._8_8_ = 0;
        auVar503._0_8_ = uVar625;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = uVar620;
        auVar504._8_8_ = 0;
        auVar504._0_8_ = uVar613;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = uVar626;
        auVar505._8_8_ = 0;
        auVar505._0_8_ = uVar599 * 2;
        auVar9 = auVar244 * auVar505 + auVar243 * auVar504 + (auVar7 >> 0x34);
        auVar245._8_8_ = 0;
        auVar245._0_8_ = (auVar9._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
        auVar11 = auVar245 * ZEXT816(0x1000003d1) + auVar242 * auVar503;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = uVar613;
        auVar506._8_8_ = 0;
        auVar506._0_8_ = uVar612;
        auVar247._8_8_ = 0;
        auVar247._0_8_ = uVar620;
        auVar507._8_8_ = 0;
        auVar507._0_8_ = uVar599;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = uVar626;
        auVar508._8_8_ = 0;
        auVar508._0_8_ = uVar626;
        auVar9 = auVar248 * auVar508 + auVar247 * auVar507 + (auVar9 >> 0x34);
        auVar249._8_8_ = 0;
        auVar249._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
        auVar12 = (auVar11 >> 0x34) + auVar246 * auVar506 + auVar249 * ZEXT816(0x1000003d10);
        uVar619 = auVar12._0_8_;
        uVar609 = auVar12._8_8_;
        auVar569._8_8_ = uVar609 >> 0x34;
        auVar569._0_8_ = uVar609 * 0x1000 | uVar619 >> 0x34;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = uVar599;
        auVar509._8_8_ = 0;
        auVar509._0_8_ = uVar612;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = uVar613;
        auVar510._8_8_ = 0;
        auVar510._0_8_ = uVar613;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = uVar620;
        auVar511._8_8_ = 0;
        auVar511._0_8_ = uVar626;
        auVar9 = auVar252 * auVar511 + (auVar9 >> 0x34);
        auVar253._8_8_ = 0;
        auVar253._0_8_ = auVar9._0_8_;
        auVar569 = auVar253 * ZEXT816(0x1000003d10) + auVar251 * auVar510 + auVar250 * auVar509 +
                   auVar569;
        auVar12 = auVar569 >> 0x34;
        auVar591._8_8_ = auVar12._8_8_;
        auVar591._0_8_ = auVar10._0_8_ & 0xffffffffffffe;
        auVar592._8_8_ = 0;
        auVar592._0_8_ = auVar12._0_8_;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = auVar9._8_8_;
        auVar592 = auVar254 * ZEXT816(0x1000003d10000) + auVar591 + auVar592;
        uVar612 = auVar592._0_8_;
        uVar1 = (auVar11._0_8_ & 0xfffffffffffff) + uVar627 + uVar624 * 2;
        uVar2 = (uVar619 & 0xfffffffffffff) + uVar615 + uVar608 * 2;
        uVar3 = (auVar569._0_8_ & 0xfffffffffffff) + uVar600 + uVar604 * 2;
        uVar4 = (uVar612 & 0xfffffffffffff) + uVar602 + uVar605 * 2;
        uVar5 = (auVar592._8_8_ << 0xc | uVar612 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff) +
                uVar621 + lVar606 * 2;
        uVar624 = uVar624 + uVar1;
        uVar608 = uVar608 + uVar2;
        uVar604 = uVar604 + uVar3;
        uVar605 = uVar605 + uVar4;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = uVar624;
        auVar512._8_8_ = 0;
        auVar512._0_8_ = uVar626;
        uVar619 = lVar606 + uVar5;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = uVar608;
        auVar513._8_8_ = 0;
        auVar513._0_8_ = uVar599;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = uVar604;
        auVar514._8_8_ = 0;
        auVar514._0_8_ = uVar613;
        auVar258._8_8_ = 0;
        auVar258._0_8_ = uVar605;
        auVar515._8_8_ = 0;
        auVar515._0_8_ = uVar625;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = uVar619;
        auVar516._8_8_ = 0;
        auVar516._0_8_ = uVar601;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = SUB168(auVar259 * auVar516,0);
        auVar11 = auVar256 * auVar513 + auVar255 * auVar512 + auVar257 * auVar514 +
                  auVar258 * auVar515 + auVar260 * ZEXT816(0x1000003d10);
        auVar261._8_8_ = 0;
        auVar261._0_8_ = uVar624;
        auVar517._8_8_ = 0;
        auVar517._0_8_ = uVar601;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = uVar608;
        auVar518._8_8_ = 0;
        auVar518._0_8_ = uVar626;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = uVar604;
        auVar519._8_8_ = 0;
        auVar519._0_8_ = uVar599;
        auVar264._8_8_ = 0;
        auVar264._0_8_ = uVar605;
        auVar520._8_8_ = 0;
        auVar520._0_8_ = uVar613;
        auVar265._8_8_ = 0;
        auVar265._0_8_ = uVar619;
        auVar521._8_8_ = 0;
        auVar521._0_8_ = uVar625;
        auVar266._8_8_ = 0;
        auVar266._0_8_ = SUB168(auVar259 * auVar516,8);
        auVar7 = auVar266 * ZEXT816(0x1000003d10000) +
                 auVar265 * auVar521 +
                 auVar264 * auVar520 +
                 auVar263 * auVar519 + auVar262 * auVar518 + auVar261 * auVar517 + (auVar11 >> 0x34)
        ;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = uVar624;
        auVar522._8_8_ = 0;
        auVar522._0_8_ = uVar625;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = uVar608;
        auVar523._8_8_ = 0;
        auVar523._0_8_ = uVar601;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = uVar604;
        auVar524._8_8_ = 0;
        auVar524._0_8_ = uVar626;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = uVar605;
        auVar525._8_8_ = 0;
        auVar525._0_8_ = uVar599;
        auVar271._8_8_ = 0;
        auVar271._0_8_ = uVar619;
        auVar526._8_8_ = 0;
        auVar526._0_8_ = uVar613;
        auVar9 = auVar271 * auVar526 +
                 auVar270 * auVar525 + auVar269 * auVar524 + auVar268 * auVar523 + (auVar7 >> 0x34);
        auVar272._8_8_ = 0;
        auVar272._0_8_ = (auVar9._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
        auVar10 = auVar272 * ZEXT816(0x1000003d1) + auVar267 * auVar522;
        uVar612 = auVar10._0_8_;
        uVar620 = auVar10._8_8_;
        auVar570._8_8_ = uVar620 >> 0x34;
        auVar570._0_8_ = uVar620 * 0x1000 | uVar612 >> 0x34;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar624;
        auVar527._8_8_ = 0;
        auVar527._0_8_ = uVar613;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar608;
        auVar528._8_8_ = 0;
        auVar528._0_8_ = uVar625;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar604;
        auVar529._8_8_ = 0;
        auVar529._0_8_ = uVar601;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = uVar605;
        auVar530._8_8_ = 0;
        auVar530._0_8_ = uVar626;
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar619;
        auVar531._8_8_ = 0;
        auVar531._0_8_ = uVar599;
        auVar9 = auVar277 * auVar531 + auVar276 * auVar530 + auVar275 * auVar529 + (auVar9 >> 0x34);
        auVar278._8_8_ = 0;
        auVar278._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
        auVar570 = auVar278 * ZEXT816(0x1000003d10) + auVar274 * auVar528 + auVar273 * auVar527 +
                   auVar570;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = uVar624;
        auVar532._8_8_ = 0;
        auVar532._0_8_ = uVar599;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = uVar608;
        auVar533._8_8_ = 0;
        auVar533._0_8_ = uVar613;
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar604;
        auVar534._8_8_ = 0;
        auVar534._0_8_ = uVar625;
        auVar282._8_8_ = 0;
        auVar282._0_8_ = uVar605;
        auVar535._8_8_ = 0;
        auVar535._0_8_ = uVar601;
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar619;
        auVar536._8_8_ = 0;
        auVar536._0_8_ = uVar626;
        auVar9 = auVar283 * auVar536 + auVar282 * auVar535 + (auVar9 >> 0x34);
        auVar284._8_8_ = 0;
        auVar284._0_8_ = auVar9._0_8_;
        auVar10 = auVar284 * ZEXT816(0x1000003d10) +
                  auVar281 * auVar534 + auVar280 * auVar533 + auVar279 * auVar532 +
                  (auVar570 >> 0x34);
        auVar12 = auVar10 >> 0x34;
        auVar594._8_8_ = 0;
        auVar594._0_8_ = auVar12._0_8_;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = auVar9._8_8_;
        auVar593._8_8_ = auVar12._8_8_;
        auVar593._0_8_ = auVar11._0_8_ & 0xfffffffffffff;
        auVar594 = auVar285 * ZEXT816(0x1000003d10000) + auVar593 + auVar594;
        uVar620 = auVar594._0_8_;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = uVar627;
        auVar537._8_8_ = 0;
        auVar537._0_8_ = uVar617;
        auVar287._8_8_ = 0;
        auVar287._0_8_ = uVar615;
        auVar538._8_8_ = 0;
        auVar538._0_8_ = uVar616;
        auVar288._8_8_ = 0;
        auVar288._0_8_ = uVar600;
        auVar539._8_8_ = 0;
        auVar539._0_8_ = uVar611;
        auVar289._8_8_ = 0;
        auVar289._0_8_ = uVar602;
        auVar540._8_8_ = 0;
        auVar540._0_8_ = uVar607;
        auVar290._8_8_ = 0;
        auVar290._0_8_ = uVar621;
        auVar541._8_8_ = 0;
        auVar541._0_8_ = uVar598;
        auVar291._8_8_ = 0;
        auVar291._0_8_ = SUB168(auVar290 * auVar541,0);
        auVar11 = auVar287 * auVar538 + auVar286 * auVar537 + auVar288 * auVar539 +
                  auVar289 * auVar540 + auVar291 * ZEXT816(0x1000003d10);
        auVar292._8_8_ = 0;
        auVar292._0_8_ = uVar627;
        auVar542._8_8_ = 0;
        auVar542._0_8_ = uVar598;
        auVar293._8_8_ = 0;
        auVar293._0_8_ = uVar615;
        auVar543._8_8_ = 0;
        auVar543._0_8_ = uVar617;
        auVar294._8_8_ = 0;
        auVar294._0_8_ = uVar600;
        auVar544._8_8_ = 0;
        auVar544._0_8_ = uVar616;
        auVar295._8_8_ = 0;
        auVar295._0_8_ = uVar602;
        auVar545._8_8_ = 0;
        auVar545._0_8_ = uVar611;
        auVar296._8_8_ = 0;
        auVar296._0_8_ = uVar621;
        auVar546._8_8_ = 0;
        auVar546._0_8_ = uVar607;
        auVar297._8_8_ = 0;
        auVar297._0_8_ = SUB168(auVar290 * auVar541,8);
        (r->z).n[0] = uVar603 & 0xfffffffffffff;
        auVar9 = auVar297 * ZEXT816(0x1000003d10000) +
                 auVar296 * auVar546 +
                 auVar295 * auVar545 +
                 auVar294 * auVar544 + auVar293 * auVar543 + auVar292 * auVar542 + (auVar11 >> 0x34)
        ;
        (r->z).n[1] = auVar565._0_8_ & 0xfffffffffffff;
        (r->z).n[2] = auVar8._0_8_ & 0xfffffffffffff;
        auVar298._8_8_ = 0;
        auVar298._0_8_ = uVar627;
        auVar547._8_8_ = 0;
        auVar547._0_8_ = uVar607;
        auVar299._8_8_ = 0;
        auVar299._0_8_ = uVar615;
        auVar548._8_8_ = 0;
        auVar548._0_8_ = uVar598;
        auVar300._8_8_ = 0;
        auVar300._0_8_ = uVar600;
        auVar549._8_8_ = 0;
        auVar549._0_8_ = uVar617;
        auVar301._8_8_ = 0;
        auVar301._0_8_ = uVar602;
        auVar550._8_8_ = 0;
        auVar550._0_8_ = uVar616;
        auVar302._8_8_ = 0;
        auVar302._0_8_ = uVar621;
        auVar551._8_8_ = 0;
        auVar551._0_8_ = uVar611;
        (r->z).n[3] = uVar614 & 0xfffffffffffff;
        auVar8 = auVar302 * auVar551 +
                 auVar301 * auVar550 + auVar300 * auVar549 + auVar299 * auVar548 + (auVar9 >> 0x34);
        (r->z).n[4] = (auVar583._8_8_ << 0xc | uVar614 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
        auVar303._8_8_ = 0;
        auVar303._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
        auVar6 = auVar298 * auVar547 + auVar303 * ZEXT816(0x1000003d1);
        uVar619 = auVar6._0_8_;
        uVar604 = auVar6._8_8_;
        auVar571._8_8_ = uVar604 >> 0x34;
        auVar571._0_8_ = uVar604 * 0x1000 | uVar619 >> 0x34;
        auVar304._8_8_ = 0;
        auVar304._0_8_ = uVar627;
        auVar552._8_8_ = 0;
        auVar552._0_8_ = uVar611;
        auVar305._8_8_ = 0;
        auVar305._0_8_ = uVar615;
        auVar553._8_8_ = 0;
        auVar553._0_8_ = uVar607;
        auVar306._8_8_ = 0;
        auVar306._0_8_ = uVar600;
        auVar554._8_8_ = 0;
        auVar554._0_8_ = uVar598;
        auVar307._8_8_ = 0;
        auVar307._0_8_ = uVar602;
        auVar555._8_8_ = 0;
        auVar555._0_8_ = uVar617;
        auVar308._8_8_ = 0;
        auVar308._0_8_ = uVar621;
        auVar556._8_8_ = 0;
        auVar556._0_8_ = uVar616;
        auVar6 = (auVar8 >> 0x34) + auVar306 * auVar554 + auVar307 * auVar555 + auVar308 * auVar556;
        uVar605 = auVar6._0_8_;
        uVar604 = auVar6._8_8_;
        auVar309._8_8_ = 0;
        auVar309._0_8_ = uVar605 & 0xfffffffffffff;
        auVar571 = auVar309 * ZEXT816(0x1000003d10) + auVar304 * auVar552 + auVar305 * auVar553 +
                   auVar571;
        auVar572._8_8_ = uVar604 >> 0x34;
        auVar572._0_8_ = uVar604 * 0x1000 | uVar605 >> 0x34;
        auVar310._8_8_ = 0;
        auVar310._0_8_ = uVar627;
        auVar557._8_8_ = 0;
        auVar557._0_8_ = uVar616;
        auVar311._8_8_ = 0;
        auVar311._0_8_ = uVar615;
        auVar558._8_8_ = 0;
        auVar558._0_8_ = uVar611;
        auVar312._8_8_ = 0;
        auVar312._0_8_ = uVar600;
        auVar559._8_8_ = 0;
        auVar559._0_8_ = uVar607;
        auVar313._8_8_ = 0;
        auVar313._0_8_ = uVar602;
        auVar560._8_8_ = 0;
        auVar560._0_8_ = uVar598;
        auVar314._8_8_ = 0;
        auVar314._0_8_ = uVar621;
        auVar561._8_8_ = 0;
        auVar561._0_8_ = uVar617;
        (r->x).n[0] = uVar1;
        auVar572 = auVar314 * auVar561 + auVar313 * auVar560 + auVar572;
        (r->x).n[1] = uVar2;
        auVar315._8_8_ = 0;
        auVar315._0_8_ = auVar572._0_8_;
        (r->x).n[2] = uVar3;
        (r->x).n[3] = uVar4;
        auVar6 = auVar315 * ZEXT816(0x1000003d10) +
                 auVar312 * auVar559 + auVar310 * auVar557 + auVar311 * auVar558 +
                 (auVar571 >> 0x34);
        (r->x).n[4] = uVar5;
        auVar8 = auVar6 >> 0x34;
        auVar596._8_8_ = 0;
        auVar596._0_8_ = auVar8._0_8_;
        auVar316._8_8_ = 0;
        auVar316._0_8_ = auVar572._8_8_;
        auVar595._8_8_ = auVar8._8_8_;
        auVar595._0_8_ = auVar11._0_8_ & 0xfffffffffffff;
        auVar596 = auVar316 * ZEXT816(0x1000003d10000) + auVar595 + auVar596;
        uVar604 = auVar596._0_8_;
        (r->y).n[0] = (uVar619 & 0xfffffffffffff) + (uVar612 & 0xfffffffffffff);
        (r->y).n[1] = (auVar571._0_8_ & 0xfffffffffffff) + (auVar570._0_8_ & 0xfffffffffffff);
        (r->y).n[2] = (auVar6._0_8_ & 0xfffffffffffff) + (auVar10._0_8_ & 0xfffffffffffff);
        (r->y).n[3] = (uVar604 & 0xfffffffffffff) + (uVar620 & 0xfffffffffffff);
        (r->y).n[4] = (auVar596._8_8_ << 0xc | uVar604 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff) +
                      (auVar594._8_8_ << 0xc | uVar620 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
      }
      else {
        iVar597 = secp256k1_fe_impl_normalizes_to_zero_var(&local_80);
        if (iVar597 != 0) {
          secp256k1_gej_double_var(r,a,rzr);
          return;
        }
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->n[4] = 0;
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        (r->x).n[4] = 0;
        (r->y).n[0] = 0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar606 = 0x10; lVar606 != 0; lVar606 = lVar606 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar1 = (b->x).n[1];
    uVar2 = (b->x).n[2];
    uVar3 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar1;
    (r->x).n[2] = uVar2;
    (r->x).n[3] = uVar3;
    (r->x).n[4] = (b->x).n[4];
    uVar1 = (b->y).n[1];
    uVar2 = (b->y).n[2];
    uVar3 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar1;
    (r->y).n[2] = uVar2;
    (r->y).n[3] = uVar3;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* Operations: 8 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
    if (rzr != NULL) SECP256K1_FE_VERIFY(rzr);
}